

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O0

void Tim_ManPrintBoxCopy(Tim_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  void *pvVar7;
  int local_1c;
  int i;
  Tim_Box_t *pBox;
  Tim_Man_t *p_local;
  
  if (p != (Tim_Man_t *)0x0) {
    printf("TIMING MANAGER:\n");
    uVar1 = Tim_ManPiNum(p);
    uVar2 = Tim_ManCiNum(p);
    uVar3 = Tim_ManPoNum(p);
    uVar4 = Tim_ManCoNum(p);
    uVar5 = Tim_ManBoxNum(p);
    printf("PI = %d. CI = %d. PO = %d. CO = %d. Box = %d.\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
           (ulong)uVar4,(ulong)uVar5);
    iVar6 = Tim_ManBoxNum(p);
    if (0 < iVar6) {
      for (local_1c = 0; iVar6 = Vec_PtrSize(p->vBoxes), local_1c < iVar6; local_1c = local_1c + 1)
      {
        pvVar7 = Vec_PtrEntry(p->vBoxes,local_1c);
        printf("%d ",(ulong)*(uint *)((long)pvVar7 + 0x14));
      }
    }
    printf("\n");
  }
  return;
}

Assistant:

void Tim_ManPrintBoxCopy( Tim_Man_t * p )
{
    Tim_Box_t * pBox;
    int i;
    if ( p == NULL )
        return;
    printf( "TIMING MANAGER:\n" );
    printf( "PI = %d. CI = %d. PO = %d. CO = %d. Box = %d.\n", 
        Tim_ManPiNum(p), Tim_ManCiNum(p), Tim_ManPoNum(p), Tim_ManCoNum(p), Tim_ManBoxNum(p) );

    if ( Tim_ManBoxNum(p) > 0 )
    Tim_ManForEachBox( p, pBox, i )
        printf( "%d ", pBox->iCopy );
    printf( "\n" );
}